

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::LockSlow(Mutex *this,MuHow how,Condition *cond,int flags)

{
  bool bVar1;
  int iVar2;
  KernelTimeout t;
  char *absl_raw_log_internal_basename;
  int flags_local;
  Condition *cond_local;
  MuHow how_local;
  Mutex *this_local;
  memory_order __b;
  memory_order __b_2;
  memory_order __b_1;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((anonymous_namespace)::globals._4_4_ == 0) {
    iVar2 = base_internal::NumCPUs();
    if (iVar2 < 2) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (anonymous_namespace)::globals._4_4_ = 0xffffffff;
    }
    else {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (anonymous_namespace)::globals._4_4_ = 0x5dc;
    }
  }
  t = synchronization_internal::KernelTimeout::Never();
  bVar1 = LockSlowWithDeadline(this,how,cond,t,flags);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x720,"Check %s failed: %s",
             "this->LockSlowWithDeadline(how, cond, KernelTimeout::Never(), flags)",
             "condition untrue on return from LockSlow");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x720,"void absl::Mutex::LockSlow(MuHow, const Condition *, int)");
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void Mutex::LockSlow(MuHow how, const Condition* cond,
                                             int flags) {
  // Note: we specifically initialize spinloop_iterations after the first use
  // in TryAcquireWithSpinning so that Lock function does not have any non-tail
  // calls and consequently a stack frame. It's fine to have spinloop_iterations
  // uninitialized (meaning no spinning) in all initial uncontended Lock calls
  // and in the first contended call. After that we will have
  // spinloop_iterations properly initialized.
  if (ABSL_PREDICT_FALSE(
          globals.spinloop_iterations.load(std::memory_order_relaxed) == 0)) {
    if (absl::base_internal::NumCPUs() > 1) {
      // If this is multiprocessor, allow spinning.
      globals.spinloop_iterations.store(1500, std::memory_order_relaxed);
    } else {
      // If this a uniprocessor, only yield/sleep.
      globals.spinloop_iterations.store(-1, std::memory_order_relaxed);
    }
  }
  ABSL_RAW_CHECK(
      this->LockSlowWithDeadline(how, cond, KernelTimeout::Never(), flags),
      "condition untrue on return from LockSlow");
}